

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sleeplock.cpp
# Opt level: O1

bool __thiscall ON_SleepLock::GetLockOrReturnFalse(ON_SleepLock *this)

{
  __atomic_flag_data_type _Var1;
  
  LOCK();
  _Var1 = (this->m_lockedX).super___atomic_flag_base._M_i;
  (this->m_lockedX).super___atomic_flag_base._M_i = true;
  UNLOCK();
  return _Var1 == false;
}

Assistant:

bool ON_SleepLock::GetLockOrReturnFalse()
{
  // returns true if the value of the m_locked changed from 0 to 1.
  // returns false if the value of m_locked was 1 and was not changed.
  // In all cases, the final value of m_locked = 1.

#if defined(ON_SLEEPLOCK_USES_STD_ATOMIC_FLAG)
  // std::atomic_flag.test_and_set
  // does the following as an atomic operation:
  //    bool b = m_lockedX;
  //    m_lockedX = true;
  //    // in all cases, the final value of m_lockedX = true.
  bool locked = m_lockedX.test_and_set(std::memory_order_acquire);
  return (false == locked);
#else
  // Windows int locked = InterlockedCompareExchange(((LONG*)(&(m_locked))), 1, 0)
  // does the following as an atomic operation:
  //    int locked = m_locked;
  //    if ( 0 == m_locked )
  //      m_locked = 1;
  //    // in all cases, the final value of m_locked = 1.
  int locked = InterlockedCompareExchange(((LONG*)(&(m_locked))), 1, 0);
  return (0 == locked);
#endif
}